

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_allow_multiple(void)

{
  int iVar1;
  int iVar2;
  uint __fd;
  undefined8 *__n;
  long lVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  ulong uVar6;
  void *__s1;
  void *__s2;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  uint uVar10;
  undefined8 *puVar11;
  int *unaff_R12;
  undefined8 *puVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  uint *__seed;
  int32_t one;
  bson_t bson;
  bson_error_t error;
  undefined1 auStack_8bc [12];
  undefined8 *puStack_8b0;
  undefined8 *puStack_8a8;
  undefined8 *puStack_8a0;
  undefined8 *puStack_898;
  uint *puStack_890;
  code *pcStack_888;
  undefined8 *puStack_808;
  undefined8 *puStack_800;
  undefined8 *puStack_7f8;
  int iStack_7ec;
  undefined8 *puStack_7e8;
  void *pvStack_7e0;
  undefined8 *puStack_7d8;
  long lStack_7d0;
  uint uStack_7c4;
  char acStack_7c0 [32];
  char acStack_7a0 [32];
  undefined8 uStack_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 uStack_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 uStack_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 auStack_6b8 [648];
  undefined8 *puStack_430;
  int *piStack_428;
  code *apcStack_408 [16];
  int local_384;
  int local_380 [52];
  undefined1 local_2b0 [648];
  
  local_380[0x1c] = 0;
  local_380[0x1d] = 0;
  local_380[0x1e] = 0;
  local_380[0x1f] = 0;
  local_380[0x18] = 0;
  local_380[0x19] = 0;
  local_380[0x1a] = 0;
  local_380[0x1b] = 0;
  local_380[0x14] = 0;
  local_380[0x15] = 0;
  local_380[0x16] = 0;
  local_380[0x17] = 0;
  local_380[0x10] = 0;
  local_380[0x11] = 0;
  local_380[0x12] = 0;
  local_380[0x13] = 0;
  local_380[0xc] = 0;
  local_380[0xd] = 0;
  local_380[0xe] = 0;
  local_380[0xf] = 0;
  local_380[8] = 0;
  local_380[9] = 0;
  local_380[10] = 0;
  local_380[0xb] = 0;
  local_380[4] = 0;
  local_380[5] = 0;
  local_380[6] = 0;
  local_380[7] = 0;
  local_380[0] = 3;
  local_380[1] = 5;
  local_380[2] = 5;
  local_380[3] = 0;
  apcStack_408[0] = (code *)0x12dfef;
  __n = (undefined8 *)
        bson_json_reader_new("{\"a\": 1}{\"b\": 1}",test_bson_json_read_cb_helper,0,0,0);
  apcStack_408[0] = (code *)0x12e007;
  lVar3 = bson_json_reader_new("{\"a\": 1}{\"b\": 1}",test_bson_json_read_cb_helper,0,1,0);
  if (__n == (undefined8 *)0x0) {
    apcStack_408[0] = (code *)0x12e294;
    test_bson_json_allow_multiple_cold_14();
LAB_0012e294:
    apcStack_408[0] = (code *)0x12e299;
    test_bson_json_allow_multiple_cold_13();
LAB_0012e299:
    apcStack_408[0] = (code *)0x12e2b1;
    test_bson_json_allow_multiple_cold_1();
LAB_0012e2b1:
    apcStack_408[0] = (code *)0x12e2b6;
    test_bson_json_allow_multiple_cold_2();
LAB_0012e2b6:
    apcStack_408[0] = (code *)0x12e2ce;
    test_bson_json_allow_multiple_cold_3();
LAB_0012e2ce:
    apcStack_408[0] = (code *)0x12e2d3;
    test_bson_json_allow_multiple_cold_4();
LAB_0012e2d3:
    apcStack_408[0] = (code *)0x12e2eb;
    test_bson_json_allow_multiple_cold_5();
LAB_0012e2eb:
    apcStack_408[0] = (code *)0x12e2f0;
    test_bson_json_allow_multiple_cold_6();
LAB_0012e2f0:
    apcStack_408[0] = (code *)0x12e308;
    test_bson_json_allow_multiple_cold_7();
LAB_0012e308:
    apcStack_408[0] = (code *)0x12e30d;
    test_bson_json_allow_multiple_cold_8();
LAB_0012e30d:
    apcStack_408[0] = (code *)0x12e325;
    test_bson_json_allow_multiple_cold_9();
LAB_0012e325:
    apcStack_408[0] = (code *)0x12e32a;
    test_bson_json_allow_multiple_cold_10();
  }
  else {
    if (lVar3 == 0) goto LAB_0012e294;
    apcStack_408[0] = (code *)0x12e034;
    iVar1 = bson_json_reader_read(__n,local_380,local_2b0);
    if (iVar1 != 1) goto LAB_0012e299;
    apcStack_408[0] = (code *)0x12e042;
    uVar4 = bson_bcone_magic();
    unaff_R12 = &local_384;
    apcStack_408[0] = (code *)0x12e06e;
    bcon_extract(local_380,"a",uVar4,0xf,unaff_R12,0);
    if (local_384 != 1) goto LAB_0012e2b1;
    unaff_R12 = local_380;
    apcStack_408[0] = (code *)0x12e08b;
    bson_reinit(unaff_R12);
    apcStack_408[0] = (code *)0x12e09e;
    iVar1 = bson_json_reader_read(__n,unaff_R12,local_2b0);
    if (iVar1 != 1) goto LAB_0012e2b6;
    unaff_R12 = &local_384;
    apcStack_408[0] = (code *)0x12e0d0;
    bcon_extract(local_380,"b",uVar4,0xf,unaff_R12,0);
    if (local_384 != 1) goto LAB_0012e2ce;
    unaff_R12 = local_380;
    apcStack_408[0] = (code *)0x12e0ed;
    bson_reinit(unaff_R12);
    apcStack_408[0] = (code *)0x12e100;
    iVar1 = bson_json_reader_read(__n,unaff_R12,local_2b0);
    if (iVar1 != 1) goto LAB_0012e2d3;
    unaff_R12 = &local_384;
    apcStack_408[0] = (code *)0x12e132;
    bcon_extract(local_380,"a",uVar4,0xf,unaff_R12,0);
    if (local_384 != 1) goto LAB_0012e2eb;
    unaff_R12 = local_380;
    apcStack_408[0] = (code *)0x12e14f;
    bson_reinit(unaff_R12);
    apcStack_408[0] = (code *)0x12e162;
    iVar1 = bson_json_reader_read(lVar3,unaff_R12,local_2b0);
    if (iVar1 != 1) goto LAB_0012e2f0;
    unaff_R12 = &local_384;
    apcStack_408[0] = (code *)0x12e194;
    bcon_extract(local_380,"a",uVar4,0xf,unaff_R12,0);
    if (local_384 != 1) goto LAB_0012e308;
    unaff_R12 = local_380;
    apcStack_408[0] = (code *)0x12e1b1;
    bson_reinit(unaff_R12);
    apcStack_408[0] = (code *)0x12e1c4;
    iVar1 = bson_json_reader_read(lVar3,unaff_R12,local_2b0);
    if (iVar1 != 1) goto LAB_0012e30d;
    unaff_R12 = &local_384;
    apcStack_408[0] = (code *)0x12e1f6;
    bcon_extract(local_380,"b",uVar4,0xf,unaff_R12,0);
    if (local_384 != 1) goto LAB_0012e325;
    unaff_R12 = local_380;
    apcStack_408[0] = (code *)0x12e213;
    bson_reinit(unaff_R12);
    apcStack_408[0] = (code *)0x12e226;
    iVar1 = bson_json_reader_read(lVar3,unaff_R12,local_2b0);
    if (iVar1 == 1) {
      unaff_R12 = &local_384;
      apcStack_408[0] = (code *)0x12e258;
      bcon_extract(local_380,"a",uVar4,0xf,unaff_R12,0);
      if (local_384 == 1) {
        apcStack_408[0] = (code *)0x12e26d;
        bson_json_reader_destroy(__n);
        apcStack_408[0] = (code *)0x12e275;
        bson_json_reader_destroy(lVar3);
        apcStack_408[0] = (code *)0x12e282;
        bson_destroy(local_380);
        return;
      }
      goto LAB_0012e342;
    }
  }
  apcStack_408[0] = (code *)0x12e342;
  test_bson_json_allow_multiple_cold_11();
LAB_0012e342:
  apcStack_408[0] = test_bson_json_read_buffering;
  test_bson_json_allow_multiple_cold_12();
  uStack_710 = 0;
  uStack_708 = 0;
  uStack_720 = 0;
  uStack_718 = 0;
  uStack_730 = 0;
  uStack_728 = 0;
  uStack_740 = 0;
  uStack_738 = 0;
  uStack_750 = 0;
  uStack_748 = 0;
  uStack_760 = 0;
  uStack_758 = 0;
  uStack_770 = 0;
  uStack_768 = 0;
  uStack_780 = 0x500000003;
  uStack_778 = 5;
  __seed = &uStack_7c4;
  uStack_7c4 = 0x2a;
  pcStack_888 = (code *)0x12e3b0;
  puStack_430 = __n;
  piStack_428 = unaff_R12;
  apcStack_408[0] = (code *)&stack0xfffffffffffffff8;
  puStack_800 = (undefined8 *)bson_string_new(0);
  puVar12 = (undefined8 *)0x1;
LAB_0012e3be:
  lStack_7d0 = (long)puVar12 * 8;
  iVar1 = 0;
  puStack_7d8 = puVar12;
LAB_0012e3d8:
  pcStack_888 = (code *)0x12e3e4;
  iStack_7ec = iVar1;
  puVar5 = (undefined8 *)bson_malloc(lStack_7d0);
  puVar13 = (undefined8 *)0x0;
  puStack_808 = puVar5;
  do {
    pcStack_888 = (code *)0x12e3f4;
    uVar4 = bson_new();
    puVar5[(long)puVar13] = uVar4;
    pcStack_888 = (code *)0x12e400;
    iVar1 = rand_r(__seed);
    if (0 < iVar1 % 5) {
      __n = (undefined8 *)0x0;
      do {
        uVar4 = puStack_808[(long)puVar13];
        pcStack_888 = (code *)0x12e439;
        iVar2 = rand_r(__seed);
        uVar9 = (long)iVar2 + ((ulong)(long)iVar2 / 3 & 0xfffffffffffffff8) * -3;
        if (uVar9 != 0) {
          uVar6 = 0;
          do {
            acStack_7c0[uVar6] = (char)uVar6 + 'a';
            uVar6 = uVar6 + 1;
          } while (uVar6 < uVar9);
        }
        acStack_7c0[uVar9] = '\0';
        pcStack_888 = (code *)0x12e480;
        iVar2 = rand_r(__seed);
        uVar9 = (long)iVar2 + ((ulong)(long)iVar2 / 3 & 0xfffffffffffffff8) * -3;
        if (uVar9 != 0) {
          uVar6 = 0;
          do {
            acStack_7a0[uVar6] = (char)uVar6 + 'a';
            uVar6 = uVar6 + 1;
          } while (uVar6 < uVar9);
        }
        acStack_7a0[uVar9] = '\0';
        pcStack_888 = (code *)0x12e4e2;
        bson_append_utf8(uVar4,acStack_7c0,0xffffffff,acStack_7a0,0xffffffff);
        uVar4 = puStack_808[(long)puVar13];
        pcStack_888 = (code *)0x12e4f3;
        iVar2 = rand_r(__seed);
        uVar9 = (long)iVar2 + ((ulong)(long)iVar2 / 3 & 0xfffffffffffffff8) * -3;
        if (uVar9 != 0) {
          uVar6 = 0;
          do {
            acStack_7c0[uVar6] = (char)uVar6 + 'a';
            uVar6 = uVar6 + 1;
          } while (uVar6 < uVar9);
        }
        acStack_7c0[uVar9] = '\0';
        pcStack_888 = (code *)0x12e53a;
        iVar2 = rand_r(__seed);
        pcStack_888 = (code *)0x12e56f;
        bson_append_int32(uVar4,acStack_7c0,0xffffffff,
                          iVar2 + ((int)((long)iVar2 * 0x40000001 >> 0x3d) - (iVar2 >> 0x1f)) *
                                  -0x7fffffff);
        uVar10 = (int)__n + 1;
        __n = (undefined8 *)(ulong)uVar10;
      } while (uVar10 != iVar1 % 5);
    }
    puVar5 = puStack_808;
    pcStack_888 = (code *)0x12e58a;
    lVar3 = bson_as_json(puStack_808[(long)puVar13],0);
    if (lVar3 == 0) goto LAB_0012e787;
    pcStack_888 = (code *)0x12e5a6;
    bson_string_append(puStack_800);
    pcStack_888 = (code *)0x12e5ae;
    bson_free(lVar3);
    puVar12 = puStack_7d8;
    puVar13 = (undefined8 *)((long)puVar13 + 1);
  } while (puVar13 != puStack_7d8);
  pcStack_888 = (code *)0x12e5ca;
  iVar1 = rand_r(__seed);
  pcStack_888 = (code *)0x12e5f6;
  puVar13 = (undefined8 *)bson_json_data_reader_new(1,(ulong)(long)iVar1 % 100);
  pcStack_888 = (code *)0x12e60f;
  bson_json_data_reader_ingest(puVar13,*puStack_800,*(undefined4 *)(puStack_800 + 1));
  puVar11 = (undefined8 *)0x0;
  while( true ) {
    __n = &uStack_780;
    pcStack_888 = (code *)0x12e629;
    puStack_7f8 = puVar11;
    bson_reinit(__n);
    pcStack_888 = (code *)0x12e63c;
    iVar1 = bson_json_reader_read(puVar13,__n,auStack_6b8);
    if (iVar1 == -1) break;
    puVar14 = puVar5;
    if (iVar1 == 0) goto LAB_0012e8cc;
    pcStack_888 = (code *)0x12e655;
    puStack_7e8 = (undefined8 *)bson_get_data(__n);
    __n = puStack_7f8;
    pcStack_888 = (code *)0x12e66e;
    pvStack_7e0 = (void *)bson_get_data(puVar5[(long)puStack_7f8]);
    if (*(int *)(puVar5[(long)__n] + 4) != uStack_780._4_4_) goto LAB_0012e78c;
    pcStack_888 = (code *)0x12e68f;
    __s1 = (void *)bson_get_data();
    pcStack_888 = (code *)0x12e69f;
    __s2 = (void *)bson_get_data(&uStack_780);
    pcStack_888 = (code *)0x12e6b1;
    iVar1 = bcmp(__s1,__s2,(ulong)*(uint *)(puVar5[(long)__n] + 4));
    puVar12 = puStack_7d8;
    if (iVar1 != 0) goto LAB_0012e78c;
    puVar11 = (undefined8 *)((long)__n + 1);
    __n = &uStack_780;
    if (puStack_7d8 == puVar11) goto code_r0x0012e6d8;
  }
  pcStack_888 = (code *)0x12e787;
  test_bson_json_read_buffering_cold_2();
LAB_0012e787:
  pcStack_888 = (code *)0x12e78c;
  test_bson_json_read_buffering_cold_9();
LAB_0012e78c:
  __seed = (uint *)&uStack_780;
  pcStack_888 = (code *)0x12e79e;
  uVar4 = bson_as_canonical_extended_json(__seed,0);
  pcStack_888 = (code *)0x12e7af;
  uVar7 = bson_as_canonical_extended_json(puVar5[(long)__n],0);
  puVar11 = puStack_7e8;
  uVar9 = 0xffffffff;
  if (uStack_780._4_4_ == 0) goto LAB_0012e7f9;
  uVar6 = 0;
  goto LAB_0012e7e0;
  while( true ) {
    if (*(char *)((long)puStack_7e8 + uVar6) != *(char *)((long)pvStack_7e0 + uVar6)) {
      uVar9 = uVar6 & 0xffffffff;
      break;
    }
    uVar6 = uVar6 + 1;
    if (uStack_780._4_4_ == (uint)uVar6) break;
LAB_0012e7e0:
    if (*(int *)(puVar5[(long)__n] + 4) == (int)uVar6) break;
  }
LAB_0012e7f9:
  if ((int)uVar9 == -1) {
    uVar10 = uStack_780._4_4_;
    if (uStack_780._4_4_ < *(uint *)(puStack_808[(long)puStack_7f8] + 4)) {
      uVar10 = *(uint *)(puStack_808[(long)puStack_7f8] + 4);
    }
    uVar9 = (ulong)(uVar10 - 1);
  }
  pcStack_888 = (code *)0x12e839;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar9,uVar4,uVar7);
  pcStack_888 = (code *)0x12e851;
  uVar10 = open("failure.bad.bson",0x42,0x1a0);
  puVar14 = (undefined8 *)(ulong)uVar10;
  pcStack_888 = (code *)0x12e86c;
  __fd = open("failure.expected.bson",0x42,0x1a0);
  __n = puVar11;
  puVar12 = puVar5;
  if (uVar10 == 0xffffffff) {
LAB_0012e8d1:
    pcStack_888 = (code *)0x12e8d6;
    test_bson_json_read_buffering_cold_7();
LAB_0012e8d6:
    pcStack_888 = (code *)0x12e8db;
    test_bson_json_read_buffering_cold_6();
LAB_0012e8db:
    pcStack_888 = (code *)0x12e8e0;
    test_bson_json_read_buffering_cold_3();
  }
  else {
    __seed = (uint *)(ulong)__fd;
    if (__fd == 0xffffffff) goto LAB_0012e8d6;
    puVar12 = (undefined8 *)(uStack_780 >> 0x20);
    pcStack_888 = (code *)0x12e890;
    puVar5 = (undefined8 *)write(uVar10,puVar11,(size_t)puVar12);
    if (puVar5 != puVar12) goto LAB_0012e8db;
    __n = (undefined8 *)(ulong)*(uint *)(puStack_808[(long)puStack_7f8] + 4);
    pcStack_888 = (code *)0x12e8bc;
    puVar5 = (undefined8 *)write(__fd,pvStack_7e0,(size_t)__n);
    if (puVar5 == __n) {
      pcStack_888 = (code *)0x12e8cc;
      test_bson_json_read_buffering_cold_5();
LAB_0012e8cc:
      pcStack_888 = (code *)0x12e8d1;
      test_bson_json_read_buffering_cold_1();
      goto LAB_0012e8d1;
    }
  }
  pcStack_888 = (code *)0x12e8e5;
  test_bson_json_read_buffering_cold_4();
  goto LAB_0012e8e5;
code_r0x0012e6d8:
  pcStack_888 = (code *)0x12e6eb;
  iVar1 = bson_json_reader_read(puVar13,__n,auStack_6b8);
  if (iVar1 != 0) {
LAB_0012e8e5:
    pcStack_888 = test_bson_json_read;
    test_bson_json_read_buffering_cold_8();
    puStack_8b0 = __n;
    puStack_8a8 = puVar12;
    puStack_8a0 = puVar13;
    puStack_898 = puVar14;
    puStack_890 = __seed;
    pcStack_888 = (code *)apcStack_408;
    bson_oid_init_from_string(auStack_8bc,"000000000000000000000000");
    uVar4 = bson_bcon_magic();
    uVar7 = bcon_new(0x1a9fbe77,0,"foo","bar","bar",uVar4,0xf,0x3035,"baz",uVar4,1,"map","{","a",
                     uVar4,0xf,1,"}","array","[",uVar4,0xf,1,uVar4,0xf,2,uVar4,0xf,3,uVar4,0xf,4,"]"
                     ,"null",uVar4,9,"boolean",uVar4,7,1,"oid",uVar4,6,auStack_8bc,"binary",uVar4,4,
                     0,"deadbeef",8,"regex",uVar4,10,"foo|bar","ism","date",uVar4,8,10000,"ref","{",
                     "$ref",uVar4,0,"foo","$id",uVar4,6,auStack_8bc);
    uVar8 = bcon_new(0,"after","b",0);
    iVar1 = 0x147e7e;
    uVar4 = bcon_new(0,"twice",uVar4,7,1,0);
    _test_bson_json_read_compare
              ("{ \n      \"foo\" : \"bar\", \n      \"bar\" : 12341, \n      \"baz\" : 123.456, \n      \"map\" : { \"a\" : 1 }, \n      \"array\" : [ 1, 2, 3, 4 ], \n      \"null\" : null, \n      \"boolean\" : true, \n      \"oid\" : { \n        \"$oid\" : \"000000000000000000000000\" \n      }, \n      \"binary\" : { \n        \"$type\" : \"00\", \n        \"$binary\" : \"ZGVhZGJlZWY=\" \n      }, \n      \"regex\" : { \n        \"$regularExpression\" : { \n          \"pattern\": \"foo|bar\", \"options\" : \"ism\" \n        } \n      }, \n      \"date\" : { \n        \"$date\" : \"1970-01-01T00:00:10Z\" \n      }, \n      \"ref\" : { \n        \"$ref\" : \"foo\", \n        \"$id\" : {\"$oid\": \"000000000000000000000000\"} \n      }, \n      \"undefined\" : { \n        \"$undefined\" : true \n      }, \n      \"minkey\" : { \n        \"$minKey\" : 1 \n      }, \n      \"maxkey\" : { \n        \"$maxKey\" : 1 \n      }, \n      \"timestamp\" : { \n        \"$timestamp\" : { \n           \"t\" : 100, \n           \"i\" : 1000 \n        } \n      } \n   } { \"after\": \"b\" } { \"twice\" : true }"
               ,iVar1,uVar7,uVar8,uVar4,0);
    return;
  }
  pcStack_888 = (code *)0x12e6fb;
  bson_json_reader_destroy(puVar13);
  pcStack_888 = (code *)0x12e70a;
  bson_string_truncate(puStack_800);
  __n = (undefined8 *)0x0;
  do {
    pcStack_888 = (code *)0x12e715;
    bson_destroy(puVar5[(long)__n]);
    __n = (undefined8 *)((long)__n + 1);
  } while (puVar12 != __n);
  pcStack_888 = (code *)0x12e725;
  bson_free(puVar5);
  iVar1 = iStack_7ec + 1;
  if (iVar1 == 0x32) goto code_r0x0012e73f;
  goto LAB_0012e3d8;
code_r0x0012e73f:
  puVar12 = (undefined8 *)((long)puVar12 + 1);
  if (puVar12 == (undefined8 *)0xa) {
    pcStack_888 = (code *)0x12e75e;
    bson_string_free(puStack_800,1);
    pcStack_888 = (code *)0x12e76b;
    bson_destroy(&uStack_780);
    return;
  }
  goto LAB_0012e3be;
}

Assistant:

static void
test_bson_json_allow_multiple (void)
{
   int32_t one;
   bson_error_t error;
   bson_json_reader_t *reader;
   bson_json_reader_t *reader_multiple;
   bson_t bson = BSON_INITIALIZER;
   bool allow_multiple = true;
   char *multiple_json = "{\"a\": 1}{\"b\": 1}";

   reader = bson_json_reader_new (
      multiple_json, &test_bson_json_read_cb_helper, NULL, !allow_multiple, 0);
   reader_multiple = bson_json_reader_new (
      multiple_json, &test_bson_json_read_cb_helper, NULL, allow_multiple, 0);
   BSON_ASSERT (reader);
   BSON_ASSERT (reader_multiple);

   /* reader with allow_multiple false */
   /* read first json */
   ASSERT_CMPINT (1, ==, bson_json_reader_read (reader, &bson, &error));
   BCON_EXTRACT (&bson, "a", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* read second json */
   bson_reinit (&bson);
   ASSERT_CMPINT (1, ==, bson_json_reader_read (reader, &bson, &error));
   BCON_EXTRACT (&bson, "b", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* start at the beginning of the string */
   bson_reinit (&bson);
   ASSERT_CMPINT (1, ==, bson_json_reader_read (reader, &bson, &error));
   BCON_EXTRACT (&bson, "a", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* reader_multiple with allow_multiple true */
   /* read first json */
   bson_reinit (&bson);
   ASSERT_CMPINT (
      1, ==, bson_json_reader_read (reader_multiple, &bson, &error));
   BCON_EXTRACT (&bson, "a", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* read second json */
   bson_reinit (&bson);
   ASSERT_CMPINT (
      1, ==, bson_json_reader_read (reader_multiple, &bson, &error));
   BCON_EXTRACT (&bson, "b", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   /* start at the beginning of the string */
   bson_reinit (&bson);
   ASSERT_CMPINT (
      1, ==, bson_json_reader_read (reader_multiple, &bson, &error));
   BCON_EXTRACT (&bson, "a", BCONE_INT32 (one));
   ASSERT_CMPINT (1, ==, one);

   bson_json_reader_destroy (reader);
   bson_json_reader_destroy (reader_multiple);
   bson_destroy (&bson);
}